

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

wstring * __thiscall
lzstring::LZString::Compress(wstring *__return_storage_ptr__,LZString *this,wstring *input)

{
  wstring *input_00;
  ulong uVar1;
  anon_class_1_0_00000001 local_41;
  GetCharFromIntFunc local_40;
  wstring *local_20;
  wstring *input_local;
  LZString *this_local;
  
  local_20 = input;
  input_local = (wstring *)this;
  this_local = (LZString *)__return_storage_ptr__;
  uVar1 = std::__cxx11::wstring::empty();
  input_00 = local_20;
  if ((uVar1 & 1) == 0) {
    std::function<wchar_t(int)>::
    function<lzstring::LZString::Compress(std::__cxx11::wstring_const&)::__0,void>
              ((function<wchar_t(int)> *)&local_40,&local_41);
    Compress(__return_storage_ptr__,this,input_00,0x10,&local_40);
    std::function<wchar_t_(int)>::~function(&local_40);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::Compress(const std::wstring &input)
{
	if (input.empty())
		return std::wstring();

	return Compress(input, 16, [](int code) { return (wchar_t)code; });
}